

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O0

int oonf_log_init(oonf_appdata *data,oonf_log_severity def_severity)

{
  int iVar1;
  size_t sVar2;
  size_t len;
  oonf_log_severity local_28;
  oonf_log_source src;
  oonf_log_severity sev;
  oonf_log_severity def_severity_local;
  oonf_appdata *data_local;
  
  _appdata = data;
  _libdata = oonf_libdata_get();
  _source_count = 6;
  _handler_list.prev = &_handler_list;
  _handler_list.next = &_handler_list;
  iVar1 = abuf_init(&_logbuffer);
  if (iVar1 == 0) {
    _max_severitytext_len = 0;
    for (local_28 = 1; local_28 < 9; local_28 = local_28 << 1) {
      sVar2 = strlen(LOG_SEVERITY_NAMES[local_28]);
      if (_max_severitytext_len < sVar2) {
        _max_severitytext_len = sVar2;
      }
    }
    _max_sourcetext_len = 0;
    for (len._4_4_ = 0; len._4_4_ < 6; len._4_4_ = len._4_4_ + 1) {
      sVar2 = strlen(LOG_SOURCE_NAMES[len._4_4_]);
      if (_max_sourcetext_len < sVar2) {
        _max_sourcetext_len = sVar2;
      }
    }
    _default_mask = '\0';
    for (local_28 = LOG_SEVERITY_DEBUG; local_28 < (LOG_SEVERITY_ASSERT|LOG_SEVERITY_DEBUG);
        local_28 = local_28 << 1) {
      if (def_severity <= local_28) {
        _default_mask = _default_mask | (byte)local_28;
      }
    }
    memset(log_global_mask,(uint)_default_mask,0x80);
    memset(_log_warnings,0,0x200);
    data_local._4_4_ = 0;
  }
  else {
    fputs("Not enough memory for logging buffer\n",_stderr);
    data_local._4_4_ = -1;
  }
  return data_local._4_4_;
}

Assistant:

int
oonf_log_init(const struct oonf_appdata *data, enum oonf_log_severity def_severity) {
  enum oonf_log_severity sev;
  enum oonf_log_source src;
  size_t len;

  _appdata = data;
  _libdata = oonf_libdata_get();
  _source_count = LOG_CORESOURCE_COUNT;

  list_init_head(&_handler_list);

  if (abuf_init(&_logbuffer)) {
    fputs("Not enough memory for logging buffer\n", stderr);
    return -1;
  }

  /* initialize maximum severity length */
  _max_severitytext_len = 0;
  OONF_FOR_ALL_LOGSEVERITIES(sev) {
    len = strlen(LOG_SEVERITY_NAMES[sev]);
    if (len > _max_severitytext_len) {
      _max_severitytext_len = len;
    }
  }

  /* initialize maximum source length */
  _max_sourcetext_len = 0;
  for (src = 0; src < LOG_CORESOURCE_COUNT; src++) {
    len = strlen(LOG_SOURCE_NAMES[src]);
    if (len > _max_sourcetext_len) {
      _max_sourcetext_len = len;
    }
  }

  /* set default mask */
  _default_mask = 0;
  OONF_FOR_ALL_LOGSEVERITIES(sev) {
    if (sev >= def_severity) {
      _default_mask |= sev;
    }
  }

  /* clear global mask */
  memset(&log_global_mask, _default_mask, sizeof(log_global_mask));

  /* clear warning counter */
  memset(_log_warnings, 0, sizeof(_log_warnings));
  return 0;
}